

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::
DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::NumericExprReader,ExprPrinter::NumericArgHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *this,int num_args,
          NumericArgHandler *arg_handler)

{
  int in_ESI;
  NumericExprReader *in_RDI;
  string *in_stack_00000008;
  NumericArgHandler *in_stack_00000010;
  int i;
  NumericExprReader expr_reader;
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> local_40;
  int local_20;
  int local_c;
  
  local_c = in_ESI;
  for (local_20 = 0; local_20 < local_c; local_20 = local_20 + 1) {
    NumericExprReader::Read_abi_cxx11_(in_RDI,&local_40);
    ExprPrinter::NumericArgHandler::AddArg(in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void DoReadArgs(int num_args, ArgHandler &arg_handler) {
    ExprReader expr_reader;
    for (int i = 0; i < num_args; ++i)
      arg_handler.AddArg(expr_reader.Read(*this));
  }